

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_layout_space_begin(nk_context *ctx,nk_layout_format fmt,float height,int widget_count)

{
  nk_panel *pnVar1;
  nk_panel *layout;
  nk_window *win;
  int widget_count_local;
  float height_local;
  nk_layout_format fmt_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x45aa,
                  "void nk_layout_space_begin(struct nk_context *, enum nk_layout_format, float, int)"
                 );
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x45ab,
                  "void nk_layout_space_begin(struct nk_context *, enum nk_layout_format, float, int)"
                 );
  }
  if (ctx->current->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x45ac,
                  "void nk_layout_space_begin(struct nk_context *, enum nk_layout_format, float, int)"
                 );
  }
  if (((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) &&
     (ctx->current->layout != (nk_panel *)0x0)) {
    pnVar1 = ctx->current->layout;
    nk_panel_layout(ctx,ctx->current,height,widget_count);
    if (fmt == NK_STATIC) {
      (pnVar1->row).type = NK_LAYOUT_STATIC_FREE;
    }
    else {
      (pnVar1->row).type = NK_LAYOUT_DYNAMIC_FREE;
    }
    (pnVar1->row).ratio = (float *)0x0;
    (pnVar1->row).filled = 0.0;
    (pnVar1->row).item_width = 0.0;
    (pnVar1->row).item_offset = 0.0;
  }
  return;
}

Assistant:

NK_API void
nk_layout_space_begin(struct nk_context *ctx, enum nk_layout_format fmt,
    float height, int widget_count)
{
    struct nk_window *win;
    struct nk_panel *layout;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    win = ctx->current;
    layout = win->layout;
    nk_panel_layout(ctx, win, height, widget_count);
    if (fmt == NK_STATIC)
        layout->row.type = NK_LAYOUT_STATIC_FREE;
    else layout->row.type = NK_LAYOUT_DYNAMIC_FREE;

    layout->row.ratio = 0;
    layout->row.filled = 0;
    layout->row.item_width = 0;
    layout->row.item_offset = 0;
}